

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_tests.cpp
# Opt level: O2

void __thiscall
bloom_tests::bloom_create_insert_serialize::test_method(bloom_create_insert_serialize *this)

{
  bool bVar1;
  readonly_property65 rVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  const_string file_00;
  Span<const_unsigned_char> vKey_01;
  const_string file_01;
  Span<const_unsigned_char> vKey_02;
  Span<const_unsigned_char> vKey_03;
  const_string file_02;
  Span<const_unsigned_char> vKey_04;
  Span<const_unsigned_char> vKey_05;
  const_string file_03;
  Span<const_unsigned_char> vKey_06;
  const_string file_04;
  const_string file_05;
  Span<const_unsigned_char> vKey_07;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar6;
  char *pcVar5;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  assertion_result local_200;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  CBloomFilter filter;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  assertion_result local_88;
  array<std::byte,_13UL> expected;
  byte local_5b [3];
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_58;
  char *pcStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CBloomFilter::CBloomFilter(&filter,3,0.01,0,'\x01');
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x27;
  file.m_begin = (iterator)&local_e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_88._0_8_ = 0x27b69bedd88a1099;
  local_88.m_message.px = (element_type *)0x45ca8b5ba80394d;
  local_88.m_message.pn.pi_._0_4_ = 0xc850098f;
  vKey.m_size = 0x14;
  vKey.m_data = (uchar *)&local_88;
  bVar1 = CBloomFilter::contains(&filter,vKey);
  local_200.m_message.px = (element_type *)0x0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01148f90;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcStack_40 = "Bloom filter should be empty!";
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_f8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_200,(lazy_ostream *)&local_58,1,1,WARN,_cVar6,(size_t)&local_100,0x27);
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x27b69bedd88a1099;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x45ca8b5ba80394d;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0xc850098f
                        );
  vKey_00.m_size = 0x14;
  vKey_00.m_data = (uchar *)&local_58;
  CBloomFilter::insert(&filter,vKey_00);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x29;
  file_00.m_begin = (iterator)&local_110;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  local_88._0_8_ = 0x27b69bedd88a1099;
  local_88.m_message.px = (element_type *)0x45ca8b5ba80394d;
  local_88.m_message.pn.pi_._0_4_ = 0xc850098f;
  vKey_01.m_size = 0x14;
  vKey_01.m_data = (uchar *)&local_88;
  local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CBloomFilter::contains(&filter,vKey_01);
  local_200.m_message.px = (element_type *)0x0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01148fd0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcStack_40 = "Bloom filter doesn\'t contain just-inserted object!";
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_128 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_200,(lazy_ostream *)&local_58,1,1,WARN,_cVar6,(size_t)&local_130,0x29);
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2b;
  file_01.m_begin = (iterator)&local_140;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_88._0_8_ = 0x27b69bedd88a1019;
  local_88.m_message.px = (element_type *)0x45ca8b5ba80394d;
  local_88.m_message.pn.pi_._0_4_ = 0xc850098f;
  vKey_02.m_size = 0x14;
  vKey_02.m_data = (uchar *)&local_88;
  bVar1 = CBloomFilter::contains(&filter,vKey_02);
  local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar1;
  local_200.m_message.px = (element_type *)0x0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01149010;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcStack_40 = "Bloom filter contains something it shouldn\'t!";
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_158 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_200,(lazy_ostream *)&local_58,1,1,WARN,_cVar6,(size_t)&local_160,0x2b);
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x5846efd986c7a2b5;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1b7ab31459ed7c28;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0xee2ea34a
                        );
  vKey_03.m_size = 0x14;
  vKey_03.m_data = (uchar *)&local_58;
  CBloomFilter::insert(&filter,vKey_03);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2e;
  file_02.m_begin = (iterator)&local_170;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180,
             msg_02);
  local_88._0_8_ = 0x5846efd986c7a2b5;
  local_88.m_message.px = (element_type *)0x1b7ab31459ed7c28;
  local_88.m_message.pn.pi_._0_4_ = 0xee2ea34a;
  vKey_04.m_size = 0x14;
  vKey_04.m_data = (uchar *)&local_88;
  local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CBloomFilter::contains(&filter,vKey_04);
  local_200.m_message.px = (element_type *)0x0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01149050;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcStack_40 = "Bloom filter doesn\'t contain just-inserted object (2)!";
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_188 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_200,(lazy_ostream *)&local_58,1,1,WARN,_cVar6,(size_t)&local_190,0x2e);
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x6e36c5b4700630b9;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x75bc188b9e69b295;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_58._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0xc529f7e5
                        );
  vKey_05.m_size = 0x14;
  vKey_05.m_data = (uchar *)&local_58;
  CBloomFilter::insert(&filter,vKey_05);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x31;
  file_03.m_begin = (iterator)&local_1a0;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b0,
             msg_03);
  local_88._0_8_ = 0x6e36c5b4700630b9;
  local_88.m_message.px = (element_type *)0x75bc188b9e69b295;
  local_88.m_message.pn.pi_._0_4_ = 0xc529f7e5;
  vKey_06.m_size = 0x14;
  vKey_06.m_data = (uchar *)&local_88;
  local_200.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CBloomFilter::contains(&filter,vKey_06);
  local_200.m_message.px = (element_type *)0x0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_58._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01149050;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
  pcStack_40 = "Bloom filter doesn\'t contain just-inserted object (3)!";
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_1b8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_200,(lazy_ostream *)&local_58,1,1,WARN,_cVar6,(size_t)&local_1c0,0x31);
  boost::detail::shared_count::~shared_count(&local_200.m_message.pn);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcStack_40 = (char *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (byte *)0x0;
  CBloomFilter::SerializationOps<DataStream,CBloomFilter_const,ActionSerialize>(&filter);
  expected._M_elems[8] = 0;
  expected._M_elems[9] = 0;
  expected._M_elems[10] = 0;
  expected._M_elems[0xb] = 0;
  expected._M_elems[0xc] = 1;
  expected._M_elems[0] = 3;
  expected._M_elems[1] = 0x61;
  expected._M_elems[2] = 0x4e;
  expected._M_elems[3] = 0x9b;
  expected._M_elems[4] = 5;
  expected._M_elems[5] = 0;
  expected._M_elems[6] = 0;
  expected._M_elems[7] = 0;
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x37;
  file_04.m_begin = (iterator)&local_1d0;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1e0,
             msg_04);
  boost::test_tools::tt_detail::equal_coll_impl::operator()
            (&local_88,(equal_coll_impl *)&local_a8,
             (byte *)((long)local_58._M_impl.super__Vector_impl_data._M_start + (long)pcStack_40),
             (__normal_iterator<std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              )local_58._M_impl.super__Vector_impl_data._M_finish,expected._M_elems,local_5b);
  local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
  local_200._0_8_ = &PTR__lazy_ostream_011480b0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e8 = "";
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_208 = "";
  pcVar5 = "stream.begin()";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0xd;
  boost::test_tools::tt_detail::report_assertion
            (&local_88,(lazy_ostream *)&local_200,1,0xd,4,0xb7b5b5,(size_t)&local_210,0x37,
             "stream.end()","expected.begin()","expected.end()");
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x39;
  file_05.m_begin = (iterator)&local_220;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_230,
             msg_05);
  local_a8 = 0x27b69bedd88a1099;
  uStack_a0 = 0x45ca8b5ba80394d;
  local_98 = 0xc850098f;
  vKey_07.m_size = 0x14;
  vKey_07.m_data = (uchar *)&local_a8;
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)CBloomFilter::contains(&filter,vKey_07);
  local_88.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_88.m_message.px = (element_type *)0x0;
  local_88.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200.m_message.px = (element_type *)((ulong)local_200.m_message.px & 0xffffffffffffff00);
  local_200._0_8_ = &PTR__lazy_ostream_01148fd0;
  local_200.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e8 = "Bloom filter doesn\'t contain just-inserted object!";
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/bloom_tests.cpp";
  local_238 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_88,(lazy_ostream *)&local_200,1,1,WARN,(check_type)pcVar5,(size_t)&local_240,
             0x39);
  boost::detail::shared_count::~shared_count(&local_88.m_message.pn);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&filter);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bloom_create_insert_serialize)
{
    CBloomFilter filter(3, 0.01, 0, BLOOM_UPDATE_ALL);

    BOOST_CHECK_MESSAGE( !filter.contains("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter should be empty!");
    filter.insert("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8);
    BOOST_CHECK_MESSAGE( filter.contains("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter doesn't contain just-inserted object!");
    // One bit different in first byte
    BOOST_CHECK_MESSAGE(!filter.contains("19108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter contains something it shouldn't!");

    filter.insert("b5a2c786d9ef4658287ced5914b37a1b4aa32eee"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.contains("b5a2c786d9ef4658287ced5914b37a1b4aa32eee"_hex_u8), "Bloom filter doesn't contain just-inserted object (2)!");

    filter.insert("b9300670b4c5366e95b2699e8b18bc75e5f729c5"_hex_u8);
    BOOST_CHECK_MESSAGE(filter.contains("b9300670b4c5366e95b2699e8b18bc75e5f729c5"_hex_u8), "Bloom filter doesn't contain just-inserted object (3)!");

    DataStream stream{};
    stream << filter;

    constexpr auto expected{"03614e9b050000000000000001"_hex};
    BOOST_CHECK_EQUAL_COLLECTIONS(stream.begin(), stream.end(), expected.begin(), expected.end());

    BOOST_CHECK_MESSAGE( filter.contains("99108ad8ed9bb6274d3980bab5a85c048f0950c8"_hex_u8), "Bloom filter doesn't contain just-inserted object!");
}